

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall wasm::PrintExpressionContents::visitThrow(PrintExpressionContents *this,Throw *curr)

{
  ostream *stream;
  
  stream = this->o;
  Colors::outputColorCode(stream,"\x1b[35m");
  Colors::outputColorCode(stream,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(stream,"throw ",6);
  Colors::outputColorCode(stream,"\x1b[0m");
  Name::print(&curr->tag,this->o);
  return;
}

Assistant:

void visitThrow(Throw* curr) {
    printMedium(o, "throw ");
    curr->tag.print(o);
  }